

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::sampler_parameterf(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  RenderContext *pRVar3;
  allocator<char> local_a1;
  string local_a0;
  deUint32 local_7c;
  ContextType local_78;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  GLuint sampler;
  NegativeTestContext *ctx_local;
  
  local_14 = 0;
  pNStack_10 = ctx;
  glu::CallLogWrapper::glGenSamplers(&ctx->super_CallLogWrapper,1,&local_14);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object previously returned from a call to ctx.glGenSamplers."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glSamplerParameterf
            (&pNStack_10->super_CallLogWrapper,0xffffffff,0x813a,-1000.0);
  NegativeTestContext::expectError(pNStack_10,0x502);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_ENUM is generated if params should have a defined constant value (based on the value of pname) and does not."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glSamplerParameterf(&pNStack_10->super_CallLogWrapper,local_14,0x2802,-1.0);
  NegativeTestContext::expectError(pNStack_10,0x500);
  NegativeTestContext::endSection(pNStack_10);
  pRVar3 = NegativeTestContext::getRenderContext(pNStack_10);
  local_78.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_7c = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(local_78,(ApiType)local_7c);
  pNVar1 = pNStack_10;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,
               "GL_INVALID_ENUM is generated if glSamplerParameterf is called for a non-scalar parameter."
               ,&local_a1);
    NegativeTestContext::beginSection(pNVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    glu::CallLogWrapper::glSamplerParameteri(&pNStack_10->super_CallLogWrapper,local_14,0x1004,0);
    NegativeTestContext::expectError(pNStack_10,0x500);
    NegativeTestContext::endSection(pNStack_10);
  }
  glu::CallLogWrapper::glDeleteSamplers(&pNStack_10->super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void sampler_parameterf (NegativeTestContext& ctx)
{
	GLuint sampler = 0;

	ctx.glGenSamplers(1, &sampler);

	ctx.beginSection("GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object previously returned from a call to ctx.glGenSamplers.");
	ctx.glSamplerParameterf(-1, GL_TEXTURE_MIN_LOD, -1000.0f);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if params should have a defined constant value (based on the value of pname) and does not.");
	ctx.glSamplerParameterf(sampler, GL_TEXTURE_WRAP_S, -1.0f);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		ctx.beginSection("GL_INVALID_ENUM is generated if glSamplerParameterf is called for a non-scalar parameter.");
		ctx.glSamplerParameteri(sampler, GL_TEXTURE_BORDER_COLOR, 0);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.endSection();
	}

	ctx.glDeleteSamplers(1, &sampler);
}